

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::BeginGlobal
          (BinaryReaderIR *this,Index index,Type type,bool mutable_)

{
  char *__s;
  Offset OVar1;
  size_t sVar2;
  pointer *__ptr;
  __uniq_ptr_impl<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_> local_38;
  
  __s = this->filename_;
  OVar1 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  sVar2 = strlen(__s);
  local_38._M_t.
  super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>.
  super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl =
       (tuple<wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>)
       operator_new(0x88);
  *(long *)((long)local_38._M_t.
                  super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>
                  .super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl + 8) = 0;
  *(long *)((long)local_38._M_t.
                  super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>
                  .super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl + 0x10) = 0;
  *(size_t *)
   ((long)local_38._M_t.
          super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>
          .super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl + 0x18) = sVar2;
  *(char **)((long)local_38._M_t.
                   super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>
                   .super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl + 0x20) =
       __s;
  *(Offset *)
   ((long)local_38._M_t.
          super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>
          .super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl + 0x28) = OVar1;
  *(undefined4 *)
   ((long)local_38._M_t.
          super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>
          .super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl + 0x30) = 0;
  *(undefined4 *)
   ((long)local_38._M_t.
          super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>
          .super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl + 0x38) = 1;
  *(undefined ***)
   local_38._M_t.
   super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>.
   super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl =
       &PTR__GlobalModuleField_00199d78;
  *(long **)((long)local_38._M_t.
                   super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>
                   .super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl + 0x40) =
       (long *)((long)local_38._M_t.
                      super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>
                      .super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl + 0x50);
  *(long *)((long)local_38._M_t.
                  super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>
                  .super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl + 0x48) = 0;
  *(undefined1 *)
   ((long)local_38._M_t.
          super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>
          .super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl + 0x50) = 0;
  *(long *)((long)local_38._M_t.
                  super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>
                  .super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl + 0x70) = 0;
  *(long *)((long)local_38._M_t.
                  super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>
                  .super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl + 0x78) = 0;
  *(long *)((long)local_38._M_t.
                  super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>
                  .super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl + 0x80) = 0;
  *(Type *)((long)local_38._M_t.
                  super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>
                  .super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl + 0x60) =
       type;
  *(bool *)((long)local_38._M_t.
                  super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>
                  .super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl + 0x68) =
       mutable_;
  Module::AppendField(this->module_,
                      (unique_ptr<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>
                       *)&local_38);
  if ((_Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>)
      local_38._M_t.
      super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>
      .super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl !=
      (GlobalModuleField *)0x0) {
    (**(code **)(*(long *)local_38._M_t.
                          super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>
                          .super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl + 8)
    )();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::BeginGlobal(Index index, Type type, bool mutable_) {
  auto field = std::make_unique<GlobalModuleField>(GetLocation());
  Global& global = field->global;
  global.type = type;
  global.mutable_ = mutable_;
  module_->AppendField(std::move(field));
  return Result::Ok;
}